

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LifeFormAppearance.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::LifeFormAppearance::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,LifeFormAppearance *this)

{
  ostream *poVar1;
  KINT32 Value;
  KINT32 Value_00;
  KINT32 Value_01;
  KINT32 Value_02;
  KINT32 Value_03;
  KINT32 Value_04;
  KINT32 Value_05;
  KStringStream ss;
  KString local_280;
  KString local_260;
  KString local_240;
  KString local_220;
  KString local_200;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Lifeform Appearance:");
  poVar1 = std::operator<<(poVar1,"\n\tPaint Scheme:         ");
  ENUMS::GetEnumAsStringEntityPaintScheme_abi_cxx11_
            (&local_1c0,(ENUMS *)(ulong)((uint)*this & 1),Value);
  poVar1 = std::operator<<(poVar1,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"\n\tDamage:               ");
  ENUMS::GetEnumAsStringEntityDamage_abi_cxx11_
            (&local_1e0,(ENUMS *)(ulong)((uint)*this >> 3 & 3),Value_00);
  poVar1 = std::operator<<(poVar1,(string *)&local_1e0);
  poVar1 = std::operator<<(poVar1,"\n\tCompliance:           ");
  ENUMS::GetEnumAsStringEntityCompliance_abi_cxx11_
            (&local_200,(ENUMS *)(ulong)((uint)*this >> 5 & 0xf),Value_01);
  poVar1 = std::operator<<(poVar1,(string *)&local_200);
  poVar1 = std::operator<<(poVar1,"\n\tSignal Smoke In Use:  ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\n\tFlash Lights:         ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\n\tSignal Mirror In Use: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\n\tIR Strobe On:         ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\n\tIR Illuminator On:    ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\n\tLifeform State:       ");
  ENUMS::GetEnumAsStringEntityLifeformAppearance_abi_cxx11_
            (&local_220,(ENUMS *)(ulong)(*(ushort *)&this->field_0x2 & 0xf),Value_02);
  poVar1 = std::operator<<(poVar1,(string *)&local_220);
  poVar1 = std::operator<<(poVar1,"\n\tFrozen Status:        ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\n\tMounted/Hoisted:      ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\n\tState:                ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\n\tWeapon 1:             ");
  ENUMS::GetEnumAsStringEntityLifeformWeapon_abi_cxx11_
            (&local_240,(ENUMS *)(ulong)((byte)this->field_0x3 & 3),Value_03);
  poVar1 = std::operator<<(poVar1,(string *)&local_240);
  poVar1 = std::operator<<(poVar1,"\n\tWeapon 2:             ");
  ENUMS::GetEnumAsStringEntityLifeformWeapon_abi_cxx11_
            (&local_260,(ENUMS *)(ulong)((uint)*this >> 0x1a & 3),Value_04);
  poVar1 = std::operator<<(poVar1,(string *)&local_260);
  poVar1 = std::operator<<(poVar1,"\n\tCamouflage:           ");
  ENUMS::GetEnumAsStringEntityCamouflage_abi_cxx11_
            (&local_280,(ENUMS *)(ulong)((uint)*this >> 0x1c & 3),Value_05);
  poVar1 = std::operator<<(poVar1,(string *)&local_280);
  poVar1 = std::operator<<(poVar1,"\n\tConcealed Stationary: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\n\tConcealed Movement:   ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString LifeFormAppearance::GetAsString() const
{
    KStringStream ss;

    ss << "Lifeform Appearance:"
       << "\n\tPaint Scheme:         " << GetEnumAsStringEntityPaintScheme( m_PaintScheme )
       << "\n\tDamage:               " << GetEnumAsStringEntityDamage( m_Damage )
       << "\n\tCompliance:           " << GetEnumAsStringEntityCompliance( m_Compliance )
       << "\n\tSignal Smoke In Use:  " << m_SignalSmokeInUse
       << "\n\tFlash Lights:         " << m_Flashlight
       << "\n\tSignal Mirror In Use: " << m_SignalMirrorInUse
       << "\n\tIR Strobe On:         " << m_IRStrobe
       << "\n\tIR Illuminator On:    " << m_IRIlluminator
       << "\n\tLifeform State:       " << GetEnumAsStringEntityLifeformAppearance( m_LifeformState )
       << "\n\tFrozen Status:        " << m_FrozenStatus
       << "\n\tMounted/Hoisted:      " << m_MountedHoisted
       << "\n\tState:                " << m_State
       << "\n\tWeapon 1:             " << GetEnumAsStringEntityLifeformWeapon( m_Weapon1 )
       << "\n\tWeapon 2:             " << GetEnumAsStringEntityLifeformWeapon( m_Weapon2 )
       << "\n\tCamouflage:           " << GetEnumAsStringEntityCamouflage( m_Camouflage )
       << "\n\tConcealed Stationary: " << m_ConcealedStationary
       << "\n\tConcealed Movement:   " << m_ConcealedMovement
       << "\n";

    return ss.str();
}